

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O1

UINT8 device_start_sn76496_maxim(SN76496_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 uVar4;
  void *pvVar5;
  DEV_DATA DVar6;
  UINT8 UVar7;
  long lVar8;
  
  uVar1 = (cfg->_genCfg).clock;
  uVar2 = (cfg->_genCfg).smplRate;
  DVar6.chipInf = calloc(1,200);
  UVar7 = 0xff;
  if ((DEV_DATA *)DVar6.chipInf != (DEV_DATA *)0x0) {
    *(float *)&((DEV_DATA *)((long)DVar6.chipInf + 0x30))->chipInf =
         ((float)uVar1 * 0.0625) / (float)uVar2;
    *(undefined1 *)&((DEV_DATA *)((long)DVar6.chipInf + 0x28))->chipInf = 0xf;
    *(undefined4 *)((long)DVar6.chipInf + 0x3c) = 9;
    *(undefined1 *)&((DEV_DATA *)((long)DVar6.chipInf + 0x40))->chipInf = 0x10;
    lVar8 = 0x9c;
    do {
      Panning_Centre((INT32 *)((long)DVar6.chipInf + lVar8));
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0xbc);
    *(undefined1 *)((long)DVar6.chipInf + 0xbc) = 0;
    ((DEV_DATA *)((long)DVar6.chipInf + 0xc0))->chipInf = (void *)0x0;
    if ((DEV_DATA *)DVar6.chipInf != (DEV_DATA *)0x0) {
      pvVar3 = *(void **)&cfg->_genCfg;
      uVar4 = *(undefined8 *)&(cfg->_genCfg).clock;
      pvVar5 = cfg->t6w28_tone;
      ((DEV_DATA *)((long)DVar6.chipInf + 0x18))->chipInf = *(void **)&cfg->noiseTaps;
      *(void **)((long)DVar6.chipInf + 0x20) = pvVar5;
      ((DEV_DATA *)((long)DVar6.chipInf + 8))->chipInf = pvVar3;
      *(undefined8 *)((long)DVar6.chipInf + 0x10) = uVar4;
      pvVar3 = cfg->t6w28_tone;
      if (pvVar3 != (void *)0x0) {
        *(undefined1 *)((long)pvVar3 + 0xbc) = 0x80;
        *(void **)((long)pvVar3 + 0xc0) = DVar6.chipInf;
        *(undefined1 *)((long)DVar6.chipInf + 0xbc) = 0x81;
        ((DEV_DATA *)((long)DVar6.chipInf + 0xc0))->chipInf = pvVar3;
      }
      UVar7 = cfg->shiftRegWidth;
      *(uint *)((long)DVar6.chipInf + 0x3c) = (uint)cfg->noiseTaps;
      *(UINT8 *)&((DEV_DATA *)((long)DVar6.chipInf + 0x40))->chipInf = UVar7;
      *(void **)DVar6.chipInf = DVar6.chipInf;
      retDevInf->dataPtr = (DEV_DATA *)DVar6.chipInf;
      retDevInf->sampleRate = uVar2;
      retDevInf->devDef = &devDef_SN76489_Maxim;
      retDevInf->linkDevCount = 0;
      retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
      UVar7 = '\0';
    }
  }
  return UVar7;
}

Assistant:

static UINT8 device_start_sn76496_maxim(const SN76496_CFG* cfg, DEV_INFO* retDevInf)
{
	SN76489_Context* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->_genCfg.smplRate;
	chip = SN76489_Init(cfg->_genCfg.clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	chip->cfg = *cfg;
	if (cfg->t6w28_tone != NULL)
		SN76489_ConnectT6W28(chip, (SN76489_Context*)cfg->t6w28_tone);
	SN76489_Config(chip, cfg->noiseTaps, cfg->shiftRegWidth);
	
	devData = &chip->_devData;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SN76489_Maxim);
	return 0x00;
}